

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void chapter3::display_word_count
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *word_count,ostream *os)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  p_Var2 = (word_count->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator<<(os,"Word count:\n");
  for (; (_Rb_tree_header *)p_Var2 != &(word_count->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(os,"\t");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p_Var2[2]._M_color);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

inline void chapter3::display_word_count(map<string, int> &word_count, ostream &os) {
    map<string, int>::const_iterator
            itr = word_count.begin(),
            end = word_count.end();

    os << "Word count:\n";
    while (itr != end) {
        os << "\t"
           << itr->first
           << ": "
           << itr->second
           << endl;
        ++itr;
    }
    os << endl;
}